

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O1

vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
* __thiscall
cmFileSet::CompileFileEntries
          (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
           *__return_storage_ptr__,cmFileSet *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pBVar3;
  string_view arg;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  cmListFileBacktrace local_98;
  long *local_88 [2];
  long local_78 [2];
  pointer local_68;
  undefined1 local_60 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar3 = (this->FileEntries).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->FileEntries).
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar3 != local_68) {
    do {
      arg._M_str = (pBVar3->Value)._M_dataplus._M_p;
      arg._M_len = (pBVar3->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_60 + 8),arg,false);
      p_Var1 = local_50;
      for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_; p_Var2 != p_Var1
          ; p_Var2 = p_Var2 + 2) {
        local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pBVar3->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pBVar3->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)&stack0xffffffffffffffc0,&local_98);
        if (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,p_Var2->_vptr__Sp_counted_base,
                   (long)p_Var2->_vptr__Sp_counted_base + *(long *)&p_Var2->_M_use_count);
        cmGeneratorExpression::Parse
                  ((cmGeneratorExpression *)local_60,(string *)&stack0xffffffffffffffc0);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
        ::
        emplace_back<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    *)local_60);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)local_60);
        cmGeneratorExpression::~cmGeneratorExpression
                  ((cmGeneratorExpression *)&stack0xffffffffffffffc0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_60 + 8));
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

void cmFileSet::ClearFileEntries()
{
  this->FileEntries.clear();
}